

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgp_client.cpp
# Opt level: O2

bool loop_established(bgp_client_peer *peer)

{
  byte bVar1;
  node<adj_ribs_in_data> *pnVar2;
  bgp_client_peer *pbVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ssize_t sVar8;
  long lVar9;
  uint8_t capability_type;
  bgp_client_peer *local_1070;
  int local_1068;
  int remain_byte;
  int append_len;
  int entire_length;
  int option_type;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined2 local_1048;
  undefined1 local_1046;
  uchar buff [4096];
  
  memset(buff,0,0x1000);
  uVar7 = recv(peer->sock,buff,0x13,0);
  if ((int)uVar7 < 1) {
    return true;
  }
  entire_length = (int)(ushort)(buff._16_2_ << 8 | (ushort)buff._16_2_ >> 8);
  local_1070 = peer;
  log<int>(TRACE,"Receiving %d bytes",&entire_length);
  local_1068 = 0;
  while( true ) {
    pbVar3 = local_1070;
    iVar6 = (int)uVar7;
    if (entire_length - iVar6 == 0 || entire_length < iVar6) break;
    remain_byte = entire_length - iVar6;
    log<int>(TRACE,"%d bytes remain",&remain_byte);
    iVar5 = remain_byte;
    if (999 < remain_byte) {
      iVar5 = 1000;
    }
    sVar8 = recv(local_1070->sock,buff + iVar6,(long)iVar5,0);
    append_len = (int)sVar8;
    if (append_len < 1) {
      local_1068 = local_1068 + 1;
      if ((short)local_1068 == 0x2711) {
        log<>(ERROR,"Failed to receive packet");
        abort();
      }
    }
    else {
      log<int>(TRACE,"New %d bytes received",&append_len);
      uVar7 = (ulong)(uint)(iVar6 + append_len);
    }
  }
  switch(buff[0x12]) {
  case '\x01':
    log<>(INFO,"Open Received");
    log<unsigned_char>(INFO,"Version: %d",buff + 0x13);
    option_type = CONCAT22(option_type._2_2_,buff._20_2_ << 8 | (ushort)buff._20_2_ >> 8);
    log<unsigned_short>(INFO,"My AS: %d",(unsigned_short *)&option_type);
    option_type = CONCAT22(option_type._2_2_,buff._22_2_ << 8 | (ushort)buff._22_2_ >> 8);
    log<unsigned_short>(INFO,"Hold Time: %d",(unsigned_short *)&option_type);
    option_type = (uint)buff._24_4_ >> 0x18 | (buff._24_4_ & 0xff0000) >> 8 |
                  (buff._24_4_ & 0xff00) << 8 | buff._24_4_ << 0x18;
    log<unsigned_int>(INFO,"BGP Id: %d",(uint *)&option_type);
    log<unsigned_char>(INFO,"Opt Length: %d",buff + 0x1c);
    if (local_1070->remote_as != (uint)(ushort)(buff._20_2_ << 8 | (ushort)buff._20_2_ >> 8)) {
      send_notification(&local_1070->super_bgp_peer,'\x02',2);
      return false;
    }
    uVar7 = 0x1d;
    while (iVar6 = (int)uVar7, iVar6 < (int)(buff[0x1c] + 0x1d)) {
      lVar9 = (long)iVar6;
      option_type = (int)buff[lVar9];
      if (option_type == 2) {
        capability_type = buff[lVar9 + 2];
        bVar1 = buff[lVar9 + 3];
        log<unsigned_char>(INFO,"Capability type : %d",&capability_type);
        if (capability_type == 'A') {
          (local_1070->super_bgp_peer).is_4_octet_as_supported = true;
          log<>(INFO,"Supported 4-octet AS number!");
        }
        uVar7 = (ulong)(iVar6 + (uint)bVar1 + 4);
      }
      else {
        log<int>(INFO,"Option type : %d",&option_type);
        uVar7 = lVar9 + 2U & 0xffffffff;
      }
    }
    (local_1070->super_bgp_peer).bgp_id =
         (uint)buff._24_4_ >> 0x18 | (buff._24_4_ & 0xff0000) >> 8 | (buff._24_4_ & 0xff00) << 8 |
         buff._24_4_ << 0x18;
    bVar4 = send_open(&local_1070->super_bgp_peer);
    if (bVar4) {
      return true;
    }
    break;
  case '\x02':
    log<>(INFO,"Update received");
    bgp_update(&local_1070->super_bgp_peer,buff,entire_length);
    return true;
  case '\x03':
    log<>(NOTICE,"Notification received");
    log<unsigned_char>(NOTICE,"Error: %d",buff + 0x13);
    log<unsigned_char>(NOTICE,"Sub: %d",buff + 0x14);
    return false;
  case '\x04':
    if ((local_1070->super_bgp_peer).state == '\x04') {
      pnVar2 = (local_1070->super_bgp_peer).adj_ribs_in;
      pnVar2->is_prefix = true;
      pnVar2->prefix = 0;
      pnVar2->prefix_len = '\0';
      pnVar2->data = (adj_ribs_in_data *)0x0;
      pnVar2->parent = (node<adj_ribs_in_data> *)0x0;
      pnVar2->node_0 = (node<adj_ribs_in_data> *)0x0;
      pnVar2->node_1 = (node<adj_ribs_in_data> *)0x0;
      (local_1070->super_bgp_peer).state = '\x05';
    }
    log<>(INFO,"Keepalive Received");
    option_type = -1;
    uStack_1054 = 0xffffffff;
    uStack_1050 = 0xffffffff;
    uStack_104c = 0xffffffff;
    local_1048 = 0x1300;
    local_1046 = 4;
    iVar6 = (**(pbVar3->super_bgp_peer)._vptr_bgp_peer)(pbVar3,&option_type,(long)iVar6);
    if ((char)iVar6 != '\0') {
      return true;
    }
    break;
  default:
    log<unsigned_char>(ERROR,"Unknown type received %d",buff + 0x12);
    return true;
  }
  log<>(ERROR,"Failed to send packet");
  return false;
}

Assistant:

bool loop_established(bgp_client_peer* peer){
    int len;
    unsigned char buff[4096];
    //printf("\e[m");
    memset(buff, 0x00, 4096);
    len = recv(peer->sock, &buff, 19, 0);
    if(len <= 0){
        return true;
    }
    auto* bgphp = reinterpret_cast<bgp_header*>(buff);

    // hex_dump(buff, 29); // dump header
    int entire_length = ntohs(bgphp->length);
    log(log_level::TRACE, "Receiving %d bytes", entire_length);

    int append_len, remain_byte;
    uint16_t error = 0;
    while(len < entire_length){
        remain_byte = entire_length - len;
        log(log_level::TRACE, "%d bytes remain", remain_byte);
        append_len = recv(peer->sock, &buff[len], std::min(remain_byte, 1000), 0);
        if(append_len <= 0){
            if(++error > 10000){
                log(log_level::ERROR, "Failed to receive packet");
                abort();
            }
            continue;
        }
        log(log_level::TRACE, "New %d bytes received", append_len);
        len += append_len;
    }

    switch(bgphp->type){
        case OPEN:{
            log(log_level::INFO, "Open Received");
            auto* bgpopp = reinterpret_cast<bgp_open*>(buff);
            log(log_level::INFO, "Version: %d", bgpopp->version);
            log(log_level::INFO, "My AS: %d", ntohs(bgpopp->my_as));
            log(log_level::INFO, "Hold Time: %d", ntohs(bgpopp->hold_time));
            log(log_level::INFO, "BGP Id: %d", ntohl(bgpopp->bgp_id));
            log(log_level::INFO, "Opt Length: %d", bgpopp->opt_length);

            if(ntohs(bgpopp->my_as) != peer->remote_as){
                send_notification(peer, bgp_error_code::OPEN_MESSAGE_ERROR, bgp_error_sub_code_open::BAD_PEER_AS);
                return false;
            }

            int read_length = 29;
            while(read_length < 29 + bgpopp->opt_length){
                int option_type = buff[read_length];
                read_length++;
                int option_length = buff[read_length];
                read_length++;
                switch(option_type){
                    case bgp_open_optional_parameter_type::CAPABILITIES:{
                        uint8_t capability_type = buff[read_length];
                        read_length++;
                        uint8_t capability_length = buff[read_length];
                        read_length++;
                        read_length += capability_length;
                        log(log_level::INFO, "Capability type : %d", capability_type);
                        switch(capability_type){
                            case bgp_capability_code::MULTIPROTOCOL_EXTENSION_FOR_BGP4:
                                break;
                            case bgp_capability_code::SUPPORT_FOR_4_OCTET_AS_NUMBER_CAPABILITY:
                                peer->is_4_octet_as_supported = true;
                                log(log_level::INFO, "Supported 4-octet AS number!");
                                break;
                        }
                    }
                        break;
                    default:
                        log(log_level::INFO, "Option type : %d", option_type);
                        break;
                }
            }
            peer->bgp_id = ntohl(bgpopp->bgp_id);

            if(!send_open(peer)){
                log(log_level::ERROR, "Failed to send packet");
                return false;
            }
        }
            break;
        case UPDATE:{
            log(log_level::INFO, "Update received");
            bgp_update(peer, buff, entire_length);
        }
            break;
        case NOTIFICATION:{
            log(log_level::NOTICE, "Notification received");
            auto* bgpntp = reinterpret_cast<bgp_notification*>(buff);
            log(log_level::NOTICE, "Error: %d", bgpntp->error);
            log(log_level::NOTICE, "Sub: %d", bgpntp->error_sub);
            return false;
        }
        case KEEPALIVE:{
            if(peer->state == OPEN_CONFIRM){
                peer->adj_ribs_in->is_prefix = true;
                peer->adj_ribs_in->prefix = 0;
                peer->adj_ribs_in->prefix_len = 0;
                peer->adj_ribs_in->data = nullptr;
                peer->adj_ribs_in->parent = nullptr;
                peer->adj_ribs_in->node_0 = nullptr;
                peer->adj_ribs_in->node_1 = nullptr;
                peer->state = ESTABLISHED;
            }
            log(log_level::INFO, "Keepalive Received");
            bgp_header header;
            memset(header.maker, 0xff, 16);
            header.length = htons(19);
            header.type = KEEPALIVE;
            if(!peer->send(&header, len)){
                log(log_level::ERROR, "Failed to send packet");
                return false;
            }
        }
            break;
        default:
            log(log_level::ERROR, "Unknown type received %d", bgphp->type);
            break;
    }
    return true;
}